

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O2

PARTITION_TYPE get_partition(AV1_COMMON *cm,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  MB_MODE_INFO **ppMVar9;
  PARTITION_TYPE PVar10;
  long lVar11;
  
  iVar6 = (cm->mi_params).mi_rows;
  PVar10 = 0xff;
  if ((mi_row < iVar6) && (iVar7 = (cm->mi_params).mi_cols, mi_col < iVar7)) {
    iVar8 = (cm->mi_params).mi_stride;
    ppMVar9 = (cm->mi_params).mi_grid_base;
    lVar11 = (long)(iVar8 * mi_row + mi_col);
    BVar1 = ppMVar9[lVar11]->bsize;
    if (BVar1 == bsize) {
      PVar10 = '\0';
    }
    else {
      bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bsize];
      bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
      bVar4 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar1];
      bVar5 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar1];
      if (BLOCK_8X8 < bsize) {
        if ((int)(mi_row + (uint)(bVar3 >> 1)) < iVar6) {
          if ((int)(mi_col + (uint)(bVar2 >> 1)) < iVar7) {
            if (bVar5 == bVar3) {
              if ((uint)bVar4 << 2 == (uint)bVar2) {
                return '\b';
              }
              return (ppMVar9[lVar11 + (int)((uint)(bVar2 >> 1) * iVar8)]->bsize != BVar1) * '\x04'
                     + '\x01';
            }
            if (bVar4 == bVar2) {
              if ((uint)bVar5 << 2 == (uint)bVar3) {
                return '\t';
              }
              return (ppMVar9[lVar11 + (ulong)(uint)(bVar3 >> 1)]->bsize != BVar1) * '\x05' + '\x02'
              ;
            }
            if ((uint)bVar4 * 2 != (uint)bVar2 || (uint)bVar5 * 2 != (uint)bVar3) {
              return '\x03';
            }
            if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [ppMVar9[lVar11 + (int)((uint)(bVar2 >> 1) * iVar8)]->bsize] == bVar3) {
              return '\x04';
            }
            return ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [ppMVar9[lVar11 + (ulong)(uint)(bVar3 >> 1)]->bsize] == bVar2) * '\x03' + '\x03'
            ;
          }
        }
      }
      PVar10 = get_partition::base_partitions[(ulong)(bVar4 < bVar2) + (ulong)(bVar5 < bVar3) * 2];
    }
  }
  return PVar10;
}

Assistant:

static inline PARTITION_TYPE get_partition(const AV1_COMMON *const cm,
                                           int mi_row, int mi_col,
                                           BLOCK_SIZE bsize) {
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols)
    return PARTITION_INVALID;

  const int offset = mi_row * mi_params->mi_stride + mi_col;
  MB_MODE_INFO **mi = mi_params->mi_grid_base + offset;
  const BLOCK_SIZE subsize = mi[0]->bsize;

  assert(bsize < BLOCK_SIZES_ALL);

  if (subsize == bsize) return PARTITION_NONE;

  const int bhigh = mi_size_high[bsize];
  const int bwide = mi_size_wide[bsize];
  const int sshigh = mi_size_high[subsize];
  const int sswide = mi_size_wide[subsize];

  if (bsize > BLOCK_8X8 && mi_row + bwide / 2 < mi_params->mi_rows &&
      mi_col + bhigh / 2 < mi_params->mi_cols) {
    // In this case, the block might be using an extended partition
    // type.
    const MB_MODE_INFO *const mbmi_right = mi[bwide / 2];
    const MB_MODE_INFO *const mbmi_below = mi[bhigh / 2 * mi_params->mi_stride];

    if (sswide == bwide) {
      // Smaller height but same width. Is PARTITION_HORZ_4, PARTITION_HORZ or
      // PARTITION_HORZ_B. To distinguish the latter two, check if the lower
      // half was split.
      if (sshigh * 4 == bhigh) return PARTITION_HORZ_4;
      assert(sshigh * 2 == bhigh);

      if (mbmi_below->bsize == subsize)
        return PARTITION_HORZ;
      else
        return PARTITION_HORZ_B;
    } else if (sshigh == bhigh) {
      // Smaller width but same height. Is PARTITION_VERT_4, PARTITION_VERT or
      // PARTITION_VERT_B. To distinguish the latter two, check if the right
      // half was split.
      if (sswide * 4 == bwide) return PARTITION_VERT_4;
      assert(sswide * 2 == bwide);

      if (mbmi_right->bsize == subsize)
        return PARTITION_VERT;
      else
        return PARTITION_VERT_B;
    } else {
      // Smaller width and smaller height. Might be PARTITION_SPLIT or could be
      // PARTITION_HORZ_A or PARTITION_VERT_A. If subsize isn't halved in both
      // dimensions, we immediately know this is a split (which will recurse to
      // get to subsize). Otherwise look down and to the right. With
      // PARTITION_VERT_A, the right block will have height bhigh; with
      // PARTITION_HORZ_A, the lower block with have width bwide. Otherwise
      // it's PARTITION_SPLIT.
      if (sswide * 2 != bwide || sshigh * 2 != bhigh) return PARTITION_SPLIT;

      if (mi_size_wide[mbmi_below->bsize] == bwide) return PARTITION_HORZ_A;
      if (mi_size_high[mbmi_right->bsize] == bhigh) return PARTITION_VERT_A;

      return PARTITION_SPLIT;
    }
  }
  const int vert_split = sswide < bwide;
  const int horz_split = sshigh < bhigh;
  const int split_idx = (vert_split << 1) | horz_split;
  assert(split_idx != 0);

  static const PARTITION_TYPE base_partitions[4] = {
    PARTITION_INVALID, PARTITION_HORZ, PARTITION_VERT, PARTITION_SPLIT
  };

  return base_partitions[split_idx];
}